

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluatePostModify(ExpressionEvalContext *ctx,ExprPostModify *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  SynBase *pSVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  ExprBase *lhs;
  undefined4 extraout_var_00;
  ExprBase *pEVar9;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar8 = Evaluate(ctx,expression->value);
      if ((pEVar8 != (ExprBase *)0x0) && (lhs = CreateLoad(ctx,pEVar8), lhs != (ExprBase *)0x0)) {
        pSVar3 = (expression->super_ExprBase).source;
        pAVar2 = ctx->ctx->allocator;
        iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
        pSVar5 = (expression->super_ExprBase).source;
        pTVar4 = lhs->type;
        pEVar9->typeID = 6;
        pEVar9->source = pSVar5;
        pEVar9->type = pTVar4;
        pEVar9->next = (ExprBase *)0x0;
        pEVar9->listed = false;
        pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
        pEVar9[1]._vptr_ExprBase = (_func_int **)0x1;
        pEVar9 = CreateBinaryOp(ctx,pSVar3,lhs,pEVar9,SYN_BINARY_OP_SUB - expression->isIncrement);
        if ((pEVar9 != (ExprBase *)0x0) && (bVar6 = CreateStore(ctx,pEVar8,pEVar9), bVar6)) {
          pEVar8 = CheckType(&expression->super_ExprBase,lhs);
          return pEVar8;
        }
      }
    }
    else {
      Report(ctx,"ERROR: instruction limit reached");
    }
    pEVar8 = (ExprBase *)0x0;
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar3;
    pEVar8->type = pTVar4;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248688;
  }
  return pEVar8;
}

Assistant:

ExprBase* EvaluatePostModify(ExpressionEvalContext &ctx, ExprPostModify *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *ptr = Evaluate(ctx, expression->value);

	if(!ptr)
		return NULL;

	ExprBase *value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	ExprBase *modified = CreateBinaryOp(ctx, expression->source, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, value->type, 1), expression->isIncrement ? SYN_BINARY_OP_ADD : SYN_BINARY_OP_SUB);

	if(!modified)
		return NULL;

	if(!CreateStore(ctx, ptr, modified))
		return NULL;

	return CheckType(expression, value);
}